

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_extract2_i64_riscv64
               (TCGContext_conflict11 *tcg_ctx,TCGv_i64 ret,TCGv_i64 al,TCGv_i64 ah,uint ofs)

{
  TCGOp *pTVar1;
  uintptr_t o;
  uintptr_t o_1;
  uintptr_t o_3;
  
  if (ofs == 0x40) {
    if (ret != ah) {
      pTVar1 = tcg_emit_op_riscv64(tcg_ctx,INDEX_op_mov_i64);
      pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
      pTVar1->args[1] = (TCGArg)(ah + (long)tcg_ctx);
    }
  }
  else if (ofs == 0) {
    if (ret != al) {
      pTVar1 = tcg_emit_op_riscv64(tcg_ctx,INDEX_op_mov_i64);
      pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
      pTVar1->args[1] = (TCGArg)(al + (long)tcg_ctx);
    }
  }
  else {
    if (al == ah) {
      tcg_gen_rotri_i64_riscv64(tcg_ctx,ret,al,ofs);
      return;
    }
    pTVar1 = tcg_emit_op_riscv64(tcg_ctx,INDEX_op_extract2_i64);
    pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar1->args[1] = (TCGArg)(al + (long)tcg_ctx);
    pTVar1->args[2] = (TCGArg)(ah + (long)tcg_ctx);
    pTVar1->args[3] = (ulong)ofs;
  }
  return;
}

Assistant:

void tcg_gen_extract2_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 al, TCGv_i64 ah,
                          unsigned int ofs)
{
    tcg_debug_assert(ofs <= 64);
    if (ofs == 0) {
        tcg_gen_mov_i64(tcg_ctx, ret, al);
    } else if (ofs == 64) {
        tcg_gen_mov_i64(tcg_ctx, ret, ah);
    } else if (al == ah) {
        tcg_gen_rotri_i64(tcg_ctx, ret, al, ofs);
    } else {
#if TCG_TARGET_HAS_extract2_i64
        tcg_gen_op4i_i64(tcg_ctx, INDEX_op_extract2_i64, ret, al, ah, ofs);
#else
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_shri_i64(tcg_ctx, t0, al, ofs);
        tcg_gen_deposit_i64(tcg_ctx, ret, t0, ah, 64 - ofs, ofs);
        tcg_temp_free_i64(tcg_ctx, t0);
#endif
    }
}